

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.c
# Opt level: O2

int mp_snprint_ext_default(char *buf,int size,char **data,int depth)

{
  int iVar1;
  uint local_30;
  char local_29;
  uint32_t len;
  int8_t type;
  
  mp_decode_ext(data,&local_29,&local_30);
  iVar1 = snprintf(buf,(long)size,"(extension: type %d, len %u)",(ulong)(uint)(int)local_29,
                   (ulong)local_30);
  return iVar1;
}

Assistant:

int
mp_snprint_ext_default(char *buf, int size, const char **data, int depth)
{
	(void) depth;
	int8_t type;
	uint32_t len;
	mp_decode_ext(data, &type, &len);
	return snprintf(buf, size, "(extension: type %d, len %u)", (int)type,
			(unsigned)len);
}